

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferAtomicFunctions.cpp
# Opt level: O3

void __thiscall glcts::TextureBufferAtomicFunctions::initTest(TextureBufferAtomicFunctions *this)

{
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  GLuint GVar4;
  undefined4 extraout_var;
  NotSupportedError *this_00;
  TestError *this_01;
  ulong uVar6;
  char *this_02;
  GLint work_group_size;
  vector<unsigned_int,_std::allocator<unsigned_int>_> data_buffer;
  string csSource;
  char *csCode;
  int local_5c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_58;
  string local_40;
  pointer local_20;
  long lVar5;
  
  if ((this->super_TestCaseBase).m_is_texture_buffer_supported == false) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Texture buffer functionality not supported, skipping",
               fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferAtomicFunctions.cpp"
               ,0x3f);
  }
  else {
    if ((this->super_TestCaseBase).m_is_shader_image_atomic_supported != false) {
      iVar2 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
      lVar5 = CONCAT44(extraout_var,iVar2);
      local_5c = 0;
      (**(code **)(lVar5 + 0x860))(0x91bf,0,&local_5c);
      dVar3 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar3,"Error getting GL_MAX_COMPUTE_WORK_GROUP_SIZE parameter value!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferAtomicFunctions.cpp"
                      ,0x4c);
      this->m_n_texels_in_texture_buffer = local_5c + 1U;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&local_58,(ulong)(local_5c + 1U),(allocator_type *)&local_40);
      if (this->m_n_texels_in_texture_buffer != 0) {
        uVar6 = 0;
        do {
          local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar6] = (uint)uVar6;
          uVar6 = uVar6 + 1;
        } while (uVar6 < this->m_n_texels_in_texture_buffer);
      }
      (**(code **)(lVar5 + 0x6c8))(1,&this->m_tbo_id);
      dVar3 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar3,"Error generating buffer object!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferAtomicFunctions.cpp"
                      ,0x58);
      (**(code **)(lVar5 + 0x40))
                ((this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,this->m_tbo_id);
      dVar3 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar3,"Error binding buffer object!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferAtomicFunctions.cpp"
                      ,0x5b);
      (**(code **)(lVar5 + 0x150))
                ((this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,
                 (ulong)this->m_n_texels_in_texture_buffer << 2,
                 local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start,0x88e8);
      dVar3 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar3,"Error allocating buffer object\'s data store!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferAtomicFunctions.cpp"
                      ,0x5f);
      (**(code **)(lVar5 + 0x6f8))(1,&this->m_tbo_tex_id);
      dVar3 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar3,"Error generating texture object!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferAtomicFunctions.cpp"
                      ,99);
      (**(code **)(lVar5 + 8))(0x84c0);
      dVar3 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar3,"Error setting active texture unit!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferAtomicFunctions.cpp"
                      ,0x66);
      (**(code **)(lVar5 + 0xb8))
                ((this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,this->m_tbo_tex_id);
      dVar3 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar3,"Error binding texture object to GL_TEXTURE_BUFFER_EXT target!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferAtomicFunctions.cpp"
                      ,0x69);
      (**(code **)(lVar5 + 0x12f8))
                ((this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,0x8236,this->m_tbo_id);
      dVar3 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar3,"Error setting buffer object as texture buffer\'s data store!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferAtomicFunctions.cpp"
                      ,0x6c);
      GVar4 = (**(code **)(lVar5 + 0x3c8))();
      this->m_po_id = GVar4;
      dVar3 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar3,"Error creating program object!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferAtomicFunctions.cpp"
                      ,0x70);
      GVar4 = (**(code **)(lVar5 + 0x3f0))(0x91b9);
      this->m_cs_id = GVar4;
      dVar3 = (**(code **)(lVar5 + 0x800))();
      this_02 = "Error creating shader object!";
      glu::checkError(dVar3,"Error creating shader object!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferAtomicFunctions.cpp"
                      ,0x73);
      getComputeShaderCode_abi_cxx11_(&local_40,(TextureBufferAtomicFunctions *)this_02,local_5c);
      local_20 = local_40._M_dataplus._M_p;
      bVar1 = TestCaseBase::buildProgram
                        (&this->super_TestCaseBase,this->m_po_id,this->m_cs_id,1,&local_20,
                         (bool *)0x0);
      if (bVar1) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_40._M_dataplus._M_p != &local_40.field_2) {
          operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
        }
        if (local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_58.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_58.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        return;
      }
      this_01 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_01,"Could not create a program object from valid compute shader object!",
                 (char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferAtomicFunctions.cpp"
                 ,0x7a);
      __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Shader image atomic functionality not supported, skipping",
               fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferAtomicFunctions.cpp"
               ,0x44);
  }
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void TextureBufferAtomicFunctions::initTest(void)
{
	/* Check if required extensions are supported */
	if (!m_is_texture_buffer_supported)
	{
		throw tcu::NotSupportedError(TEXTURE_BUFFER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	if (!m_is_shader_image_atomic_supported)
	{
		throw tcu::NotSupportedError(SHADER_IMAGE_ATOMIC_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	/* Get GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	glw::GLint work_group_size = 0;
	gl.getIntegeri_v(GL_MAX_COMPUTE_WORK_GROUP_SIZE, 0, &work_group_size);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error getting GL_MAX_COMPUTE_WORK_GROUP_SIZE parameter value!");

	m_n_texels_in_texture_buffer = (glw::GLuint)work_group_size + 1;
	std::vector<glw::GLuint> data_buffer(m_n_texels_in_texture_buffer);

	for (glw::GLuint i = 0; i < m_n_texels_in_texture_buffer; ++i)
	{
		data_buffer[i] = i;
	}

	/* Create buffer object */
	gl.genBuffers(1, &m_tbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error generating buffer object!");

	gl.bindBuffer(m_glExtTokens.TEXTURE_BUFFER, m_tbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding buffer object!");

	gl.bufferData(m_glExtTokens.TEXTURE_BUFFER, m_n_texels_in_texture_buffer * sizeof(glw::GLuint), &data_buffer[0],
				  GL_DYNAMIC_DRAW);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error allocating buffer object's data store!");

	/* Initialize texture buffer */
	gl.genTextures(1, &m_tbo_tex_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error generating texture object!");

	gl.activeTexture(GL_TEXTURE0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting active texture unit!");

	gl.bindTexture(m_glExtTokens.TEXTURE_BUFFER, m_tbo_tex_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding texture object to GL_TEXTURE_BUFFER_EXT target!");

	gl.texBuffer(m_glExtTokens.TEXTURE_BUFFER, GL_R32UI, m_tbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting buffer object as texture buffer's data store!");

	/* Create program object */
	m_po_id = gl.createProgram();
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error creating program object!");

	m_cs_id = gl.createShader(GL_COMPUTE_SHADER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error creating shader object!");

	std::string csSource = getComputeShaderCode(work_group_size);
	const char* csCode   = csSource.c_str();

	if (!buildProgram(m_po_id, m_cs_id, 1, &csCode))
	{
		TCU_FAIL("Could not create a program object from valid compute shader object!");
	}
}